

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metamakefile.cpp
# Opt level: O3

void __thiscall SubdirsMetaMakefileGenerator::Subdir::~Subdir(Subdir *this)

{
  Data *pDVar1;
  
  if (this->makefile != (MetaMakefileGenerator *)0x0) {
    (*this->makefile->_vptr_MetaMakefileGenerator[1])();
  }
  pDVar1 = (this->output_file).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->output_file).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->output_dir).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->output_dir).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->input_dir).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
      QArrayData::deallocate(&((this->input_dir).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

~Subdir() { delete makefile; }